

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.h
# Opt level: O2

ma_result ma_decoding_backend_init__mp3
                    (void *pUserData,ma_read_proc onRead,ma_seek_proc onSeek,ma_tell_proc onTell,
                    void *pReadSeekTellUserData,ma_decoding_backend_config *pConfig,
                    ma_allocation_callbacks *pAllocationCallbacks,ma_data_source **ppBackend)

{
  ma_result mVar1;
  ma_mp3 *pMP3;
  
  pMP3 = (ma_mp3 *)ma_malloc(0x3f40,pAllocationCallbacks);
  if (pMP3 == (ma_mp3 *)0x0) {
    mVar1 = MA_OUT_OF_MEMORY;
  }
  else {
    mVar1 = ma_mp3_init(onRead,onSeek,onTell,pReadSeekTellUserData,pConfig,pAllocationCallbacks,pMP3
                       );
    if (mVar1 == MA_SUCCESS) {
      *ppBackend = pMP3;
      mVar1 = MA_SUCCESS;
    }
    else {
      ma_free(pMP3,pAllocationCallbacks);
    }
  }
  return mVar1;
}

Assistant:

static ma_result ma_decoding_backend_init__mp3(void* pUserData, ma_read_proc onRead, ma_seek_proc onSeek, ma_tell_proc onTell, void* pReadSeekTellUserData, const ma_decoding_backend_config* pConfig, const ma_allocation_callbacks* pAllocationCallbacks, ma_data_source** ppBackend)
{
    ma_result result;
    ma_mp3* pMP3;

    (void)pUserData;    /* For now not using pUserData, but once we start storing the vorbis decoder state within the ma_decoder structure this will be set to the decoder so we can avoid a malloc. */

    /* For now we're just allocating the decoder backend on the heap. */
    pMP3 = (ma_mp3*)ma_malloc(sizeof(*pMP3), pAllocationCallbacks);
    if (pMP3 == NULL) {
        return MA_OUT_OF_MEMORY;
    }

    result = ma_mp3_init(onRead, onSeek, onTell, pReadSeekTellUserData, pConfig, pAllocationCallbacks, pMP3);
    if (result != MA_SUCCESS) {
        ma_free(pMP3, pAllocationCallbacks);
        return result;
    }

    *ppBackend = pMP3;

    return MA_SUCCESS;
}